

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::DecimalFormat::getPadCharacterString
          (UnicodeString *__return_storage_ptr__,DecimalFormat *this)

{
  DecimalFormatProperties *pDVar1;
  ConstChar16Ptr local_20 [3];
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if ((undefined1  [56])((undefined1  [56])(pDVar1->padString).fUnion & (undefined1  [56])0x1) ==
      (undefined1  [56])0x0) {
    icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,&pDVar1->padString);
  }
  else {
    local_20[0].p_ = L" ";
    icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',local_20,-1);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalFormat::getPadCharacterString() const {
    if (fields->properties->padString.isBogus()) {
        // Readonly-alias the static string kFallbackPaddingString
        return {TRUE, kFallbackPaddingString, -1};
    } else {
        return fields->properties->padString;
    }
}